

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O2

int __thiscall
Solution::clone(Solution *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  value_type in_RAX;
  _List_node_base *this_00;
  undefined4 extraout_var;
  void *extraout_RDX;
  void *__child_stack_00;
  void *extraout_RDX_00;
  Solution *pSVar2;
  value_type local_28;
  
  local_28 = in_RAX;
  this_00 = (_List_node_base *)operator_new(0x20);
  *(size_t *)(this_00 + 1) = 0;
  *(undefined8 *)((long)(this_00 + 1) + 8) = 0;
  this_00->_M_prev = this_00;
  this_00->_M_next = this_00;
  __child_stack_00 = extraout_RDX;
  pSVar2 = this;
  while (pSVar2 = (Solution *)
                  (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl
                  ._M_node.super__List_node_base._M_next, pSVar2 != this) {
    iVar1 = Vehicle::clone((Vehicle *)
                           (pSVar2->vehicles).
                           super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
                           _M_size,(__fn *)this_00,__child_stack_00,__flags,__arg);
    local_28 = (value_type)CONCAT44(extraout_var,iVar1);
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
              ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)this_00,&local_28);
    __child_stack_00 = extraout_RDX_00;
  }
  this_00[1]._M_prev = (_List_node_base *)this->weight;
  return (int)this_00;
}

Assistant:

Solution *Solution::clone() {
    auto s = new Solution();
    for (auto vehicle: this->vehicles) {
        s->vehicles.push_back(vehicle->clone(s));
    }
    s->weight = this->weight;
    return s;
}